

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

int32_t __thiscall
helics::CommonCore::getHandleOption(CommonCore *this,InterfaceHandle handle,int32_t option)

{
  int32_t iVar1;
  _Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  *p_Var2;
  FederateState *this_00;
  shared_lock<std::shared_mutex> local_38;
  
  p_Var2 = getHandleInfo(this,handle);
  iVar1 = 0;
  if (p_Var2 != (_Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                 *)0x0) {
    if ((option == 0x192) || (option == 0x18d)) {
      local_38._M_pm = &(this->handles).m_mutex;
      local_38._M_owns = true;
      std::__shared_mutex_pthread::lock_shared(&(local_38._M_pm)->_M_impl);
      iVar1 = HandleManager::getHandleOption(&(this->handles).m_obj,handle,option);
      std::shared_lock<std::shared_mutex>::~shared_lock(&local_38);
    }
    else {
      iVar1 = 0;
      if ((p_Var2->
          super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
          ).
          super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
          ._M_storage._M_storage.__data[4] != 'f') {
        this_00 = getFederateAt(this,(LocalFederateId)
                                     *(BaseType *)
                                      &(p_Var2->
                                       super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                                       ).
                                       super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                                       ._M_storage._M_storage);
        if (this_00 != (FederateState *)0x0) {
          iVar1 = FederateState::getHandleOption
                            (this_00,handle,
                             (p_Var2->
                             super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                             ._M_storage._M_storage.__data[4],option);
          return iVar1;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int32_t CommonCore::getHandleOption(InterfaceHandle handle, int32_t option) const
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        return 0;
    }
    switch (option) {
        case defs::Options::CONNECTION_REQUIRED:
        case defs::Options::CONNECTION_OPTIONAL:
            return handles.read(
                [handle, option](auto& hand) { return hand.getHandleOption(handle, option); });
        default:
            break;
    }
    if (handleInfo->handleType != InterfaceType::FILTER) {
        auto* fed = getFederateAt(handleInfo->local_fed_id);
        if (fed != nullptr) {
            return fed->getHandleOption(handle, static_cast<char>(handleInfo->handleType), option);
        }
    } else {
        // must be for filter
    }
    return 0;
}